

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  uint *puVar1;
  int i;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
      return;
    }
    puVar1 = (this->bigits_).start_;
    uVar5 = 0;
    for (lVar2 = 0; uVar4 = (ulong)this->used_digits_, lVar2 < (long)uVar4; lVar2 = lVar2 + 1) {
      uVar4 = (ulong)puVar1[lVar2];
      uVar6 = (ulong)((uint)uVar5 & 0xfffffff) + (factor & 0xffffffff) * uVar4;
      puVar1[lVar2] = (uint)uVar6 & 0xfffffff;
      uVar5 = uVar4 * (factor >> 0x1c & 0xfffffffffffffff0) + (uVar5 >> 0x1c) + (uVar6 >> 0x1c);
    }
    puVar1 = (this->bigits_).start_;
    for (; uVar5 != 0; uVar5 = uVar5 >> 0x1c) {
      if (0x7f < (int)uVar4) {
        abort();
      }
      puVar1[(int)uVar4] = (uint)uVar5 & 0xfffffff;
      uVar3 = this->used_digits_ + 1;
      uVar4 = (ulong)uVar3;
      this->used_digits_ = uVar3;
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(uint64_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  uint64_t low = factor & 0xFFFFFFFF;
  uint64_t high = factor >> 32;
  for (int i = 0; i < used_digits_; ++i) {
    uint64_t product_low = low * bigits_[i];
    uint64_t product_high = high * bigits_[i];
    uint64_t tmp = (carry & kBigitMask) + product_low;
    bigits_[i] = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}